

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::copy_render_pass
          (Impl *this,VkRenderPassCreateInfo *create_info,ScratchAllocator *alloc,
          VkRenderPassCreateInfo **out_create_info)

{
  VkAttachmentDescription *__src;
  VkSubpassDescription *__src_00;
  VkSubpassDependency *__src_01;
  undefined8 *puVar1;
  void *pvVar2;
  undefined4 uVar3;
  uint32_t uVar4;
  undefined4 uVar5;
  VkRenderPassCreateFlags VVar6;
  uint32_t uVar7;
  VkStructureType VVar8;
  undefined4 uVar9;
  bool bVar10;
  VkRenderPassCreateInfo *pVVar11;
  VkAttachmentDescription *pVVar12;
  VkSubpassDescription *pVVar13;
  VkSubpassDependency *pVVar14;
  undefined8 *puVar15;
  void *pvVar16;
  ulong uVar17;
  size_t sVar18;
  long lVar19;
  ulong uVar20;
  
  pVVar11 = (VkRenderPassCreateInfo *)ScratchAllocator::allocate_raw(alloc,0x40,0x10);
  if (pVVar11 != (VkRenderPassCreateInfo *)0x0) {
    VVar8 = create_info->sType;
    uVar9 = *(undefined4 *)&create_info->field_0x4;
    pvVar2 = create_info->pNext;
    VVar6 = create_info->flags;
    uVar7 = create_info->attachmentCount;
    pVVar12 = create_info->pAttachments;
    uVar4 = create_info->subpassCount;
    uVar5 = *(undefined4 *)&create_info->field_0x24;
    pVVar13 = create_info->pSubpasses;
    uVar3 = *(undefined4 *)&create_info->field_0x34;
    pVVar14 = create_info->pDependencies;
    pVVar11->dependencyCount = create_info->dependencyCount;
    *(undefined4 *)&pVVar11->field_0x34 = uVar3;
    pVVar11->pDependencies = pVVar14;
    pVVar11->subpassCount = uVar4;
    *(undefined4 *)&pVVar11->field_0x24 = uVar5;
    pVVar11->pSubpasses = pVVar13;
    pVVar11->flags = VVar6;
    pVVar11->attachmentCount = uVar7;
    pVVar11->pAttachments = pVVar12;
    pVVar11->sType = VVar8;
    *(undefined4 *)&pVVar11->field_0x4 = uVar9;
    pVVar11->pNext = pvVar2;
  }
  if ((ulong)pVVar11->attachmentCount == 0) {
    pVVar12 = (VkAttachmentDescription *)0x0;
  }
  else {
    __src = pVVar11->pAttachments;
    sVar18 = (ulong)pVVar11->attachmentCount * 0x24;
    pVVar12 = (VkAttachmentDescription *)ScratchAllocator::allocate_raw(alloc,sVar18,0x10);
    if (pVVar12 != (VkAttachmentDescription *)0x0) {
      memmove(pVVar12,__src,sVar18);
    }
  }
  pVVar11->pAttachments = pVVar12;
  if ((ulong)pVVar11->subpassCount == 0) {
    pVVar13 = (VkSubpassDescription *)0x0;
  }
  else {
    __src_00 = pVVar11->pSubpasses;
    sVar18 = (ulong)pVVar11->subpassCount * 0x48;
    pVVar13 = (VkSubpassDescription *)ScratchAllocator::allocate_raw(alloc,sVar18,0x10);
    if (pVVar13 != (VkSubpassDescription *)0x0) {
      memmove(pVVar13,__src_00,sVar18);
    }
  }
  pVVar11->pSubpasses = pVVar13;
  if ((ulong)pVVar11->dependencyCount == 0) {
    pVVar14 = (VkSubpassDependency *)0x0;
  }
  else {
    __src_01 = pVVar11->pDependencies;
    sVar18 = (ulong)pVVar11->dependencyCount * 0x1c;
    pVVar14 = (VkSubpassDependency *)ScratchAllocator::allocate_raw(alloc,sVar18,0x10);
    if (pVVar14 != (VkSubpassDependency *)0x0) {
      memmove(pVVar14,__src_01,sVar18);
    }
  }
  pVVar11->pDependencies = pVVar14;
  if (pVVar11->subpassCount != 0) {
    lVar19 = 0x40;
    uVar20 = 0;
    do {
      pVVar13 = pVVar11->pSubpasses;
      puVar1 = *(undefined8 **)((long)pVVar13 + lVar19 + -0x10);
      if (puVar1 != (undefined8 *)0x0) {
        puVar15 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,8,0x10);
        if (puVar15 != (undefined8 *)0x0) {
          *puVar15 = *puVar1;
        }
        *(undefined8 **)((long)pVVar13 + lVar19 + -0x10) = puVar15;
      }
      pvVar2 = *(void **)((long)pVVar13 + lVar19 + -0x20);
      if (pvVar2 != (void *)0x0) {
        uVar17 = (ulong)*(uint *)((long)pVVar13 + lVar19 + -0x28);
        if (uVar17 == 0) {
          pvVar16 = (void *)0x0;
        }
        else {
          sVar18 = uVar17 << 3;
          pvVar16 = ScratchAllocator::allocate_raw(alloc,sVar18,0x10);
          if (pvVar16 != (void *)0x0) {
            memmove(pvVar16,pvVar2,sVar18);
          }
        }
        *(void **)((long)pVVar13 + lVar19 + -0x20) = pvVar16;
      }
      pvVar2 = *(void **)((long)pVVar13 + lVar19 + -0x18);
      if (pvVar2 != (void *)0x0) {
        uVar17 = (ulong)*(uint *)((long)pVVar13 + lVar19 + -0x28);
        if (uVar17 == 0) {
          pvVar16 = (void *)0x0;
        }
        else {
          sVar18 = uVar17 << 3;
          pvVar16 = ScratchAllocator::allocate_raw(alloc,sVar18,0x10);
          if (pvVar16 != (void *)0x0) {
            memmove(pvVar16,pvVar2,sVar18);
          }
        }
        *(void **)((long)pVVar13 + lVar19 + -0x18) = pvVar16;
      }
      pvVar2 = *(void **)((long)pVVar13 + lVar19 + -0x30);
      if (pvVar2 != (void *)0x0) {
        uVar17 = (ulong)*(uint *)((long)pVVar13 + lVar19 + -0x38);
        if (uVar17 == 0) {
          pvVar16 = (void *)0x0;
        }
        else {
          sVar18 = uVar17 << 3;
          pvVar16 = ScratchAllocator::allocate_raw(alloc,sVar18,0x10);
          if (pvVar16 != (void *)0x0) {
            memmove(pvVar16,pvVar2,sVar18);
          }
        }
        *(void **)((long)pVVar13 + lVar19 + -0x30) = pvVar16;
      }
      pvVar2 = *(void **)((long)&pVVar13->flags + lVar19);
      if (pvVar2 != (void *)0x0) {
        uVar17 = (ulong)*(uint *)((long)pVVar13 + lVar19 + -8);
        if (uVar17 == 0) {
          pvVar16 = (void *)0x0;
        }
        else {
          sVar18 = uVar17 << 2;
          pvVar16 = ScratchAllocator::allocate_raw(alloc,sVar18,0x10);
          if (pvVar16 != (void *)0x0) {
            memmove(pvVar16,pvVar2,sVar18);
          }
        }
        *(void **)((long)&pVVar13->flags + lVar19) = pvVar16;
      }
      uVar20 = uVar20 + 1;
      lVar19 = lVar19 + 0x48;
    } while (uVar20 < pVVar11->subpassCount);
  }
  bVar10 = copy_pnext_chain(this,create_info->pNext,alloc,&pVVar11->pNext,(DynamicStateInfo *)0x0,0)
  ;
  if (bVar10) {
    *out_create_info = pVVar11;
  }
  return bVar10;
}

Assistant:

bool StateRecorder::Impl::copy_render_pass(const VkRenderPassCreateInfo *create_info, ScratchAllocator &alloc,
                                           VkRenderPassCreateInfo **out_create_info)
{
	auto *info = copy(create_info, 1, alloc);
	info->pAttachments = copy(info->pAttachments, info->attachmentCount, alloc);
	info->pSubpasses = copy(info->pSubpasses, info->subpassCount, alloc);
	info->pDependencies = copy(info->pDependencies, info->dependencyCount, alloc);

	for (uint32_t i = 0; i < info->subpassCount; i++)
	{
		auto &sub = const_cast<VkSubpassDescription &>(info->pSubpasses[i]);
		if (sub.pDepthStencilAttachment)
			sub.pDepthStencilAttachment = copy(sub.pDepthStencilAttachment, 1, alloc);
		if (sub.pColorAttachments)
			sub.pColorAttachments = copy(sub.pColorAttachments, sub.colorAttachmentCount, alloc);
		if (sub.pResolveAttachments)
			sub.pResolveAttachments = copy(sub.pResolveAttachments, sub.colorAttachmentCount, alloc);
		if (sub.pInputAttachments)
			sub.pInputAttachments = copy(sub.pInputAttachments, sub.inputAttachmentCount, alloc);
		if (sub.pPreserveAttachments)
			sub.pPreserveAttachments = copy(sub.pPreserveAttachments, sub.preserveAttachmentCount, alloc);
	}

	if (!copy_pnext_chain(create_info->pNext, alloc, &info->pNext, nullptr, 0))
		return false;

	*out_create_info = info;
	return true;
}